

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O0

void bonk_read(t_bonk *x,t_symbol *s)

{
  int iVar1;
  t_template_conflict *ptVar2;
  int filedesc;
  char *bufptr;
  char buf [1000];
  FILE *fd;
  t_float *fp2;
  float *fp;
  uint local_340;
  int remaining;
  int ntemplate;
  int i;
  float vec [200];
  t_symbol *s_local;
  t_bonk *x_local;
  
  local_340 = 0;
  vec._792_8_ = s;
  iVar1 = canvas_open(x->x_canvas,s->s_name,"",(char *)&bufptr,(char **)&stack0xfffffffffffff8b0,
                      1000,0);
  if ((-1 < iVar1) && (buf._992_8_ = fdopen(iVar1,"r"), (FILE *)buf._992_8_ != (FILE *)0x0)) {
    ptVar2 = (t_template_conflict *)resizebytes(x->x_template,(long)x->x_ntemplate * 800,0);
    x->x_template = ptVar2;
    do {
      fp2 = (t_float *)&ntemplate;
      remaining = x->x_nfilters;
      while (remaining != 0) {
        iVar1 = __isoc99_fscanf(buf._992_8_,"%f",fp2);
        if (iVar1 < 1) {
          iVar1 = (int)local_340 % x->x_ninsig;
          if (iVar1 != 0) {
            post("bonk_read: %d templates not a multiple of %d; dropping extras");
            ptVar2 = (t_template_conflict *)
                     resizebytes(x->x_template,(long)(int)local_340 * 800,
                                 (long)(int)(local_340 - iVar1) * 800);
            x->x_template = ptVar2;
            local_340 = local_340 - iVar1;
          }
          post("bonk: read %d templates\n",(ulong)local_340);
          x->x_ntemplate = local_340;
          fclose((FILE *)buf._992_8_);
          return;
        }
        fp2 = fp2 + 1;
        remaining = remaining + -1;
      }
      ptVar2 = (t_template_conflict *)
               resizebytes(x->x_template,(long)(int)local_340 * 800,(long)(int)(local_340 + 1) * 800
                          );
      x->x_template = ptVar2;
      fd = (FILE *)(x->x_template + (int)local_340);
      fp2 = (t_float *)&ntemplate;
      remaining = x->x_nfilters;
      while (remaining != 0) {
        fd->_flags = (int)*fp2;
        fd = (FILE *)&fd->field_0x4;
        fp2 = fp2 + 1;
        remaining = remaining + -1;
      }
      local_340 = local_340 + 1;
    } while( true );
  }
  post("%s: open failed",*(undefined8 *)vec._792_8_);
  return;
}

Assistant:

static void bonk_read(t_bonk *x, t_symbol *s)
{
    float vec[MAXNFILTERS];
    int i, ntemplate = 0, remaining;
    float *fp;
    t_float *fp2;

    /* fbar: canvas_open code taken from g_array.c */
    FILE *fd;
    char buf[MAXPDSTRING], *bufptr;
    int filedesc;

    if ((filedesc = canvas_open(x->x_canvas,
            s->s_name, "", buf, &bufptr, MAXPDSTRING, 0)) < 0 
                || !(fd = fdopen(filedesc, "r")))
    {
        post("%s: open failed", s->s_name);
        return;
    }
    x->x_template = (t_template *)t_resizebytes(x->x_template, 
        x->x_ntemplate * sizeof(t_template), 0);
    while (1)
    {
        for (i = x->x_nfilters, fp = vec; i--; fp++)
            if (fscanf(fd, "%f", fp) < 1) goto nomore;
        x->x_template = (t_template *)t_resizebytes(x->x_template,
            ntemplate * sizeof(t_template),
                (ntemplate + 1) * sizeof(t_template));
        for (i = x->x_nfilters, fp = vec,
             fp2 = x->x_template[ntemplate].t_amp; i--;)
            *fp2++ = *fp++;
        ntemplate++;
    }
nomore:
    if ((remaining = (ntemplate % x->x_ninsig)))
    {
        post("bonk_read: %d templates not a multiple of %d; dropping extras");
        x->x_template = (t_template *)t_resizebytes(x->x_template,
            ntemplate * sizeof(t_template),
                (ntemplate - remaining) * sizeof(t_template));
        ntemplate = ntemplate - remaining;
    }
    post("bonk: read %d templates\n", ntemplate);
    x->x_ntemplate = ntemplate;
    fclose(fd);
}